

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O2

XMLSize_t __thiscall
xercesc_4_0::ICULCPTranscoder::calcRequiredSize
          (ICULCPTranscoder *this,XMLCh *srcText,MemoryManager *manager)

{
  int iVar1;
  XMLSize_t XVar2;
  int iVar3;
  UErrorCode err;
  XMLMutexLock lockConverter;
  
  if (srcText == (XMLCh *)0x0) {
    XVar2 = 0;
  }
  else {
    err = U_ZERO_ERROR;
    XMLMutexLock::XMLMutexLock(&lockConverter,&this->fMutex);
    iVar1 = ucnv_fromUChars_70(this->fConverter,0,0,srcText,0xffffffffffffffff,&err);
    XMLMutexLock::~XMLMutexLock(&lockConverter);
    iVar3 = 0;
    if (err == U_BUFFER_OVERFLOW_ERROR) {
      iVar3 = iVar1;
    }
    XVar2 = (XMLSize_t)iVar3;
  }
  return XVar2;
}

Assistant:

XMLSize_t ICULCPTranscoder::calcRequiredSize(const XMLCh* const srcText
                                                , MemoryManager* const manager)
{
    if (!srcText)
        return 0;

    //
    //  We do two different versions of this, according to whether XMLCh
    //  is the same size as UChar or not.
    //
    UErrorCode err = U_ZERO_ERROR;
    int32_t targetCap;
    if (sizeof(XMLCh) == sizeof(UChar))
    {
        // Use a faux scope to synchronize while we do this
        {
            XMLMutexLock lockConverter(&fMutex);

            targetCap = ucnv_fromUChars
            (
                fConverter
                , 0
                , 0
                , (const UChar*)srcText
                , -1
                , &err
            );
        }
    }
    else
    {
        // Copy the source to a local temp
        UChar* tmpBuf = convertToUChar(srcText, 0, manager);
        ArrayJanitor<UChar> janTmp(tmpBuf, manager);

        // Use a faux scope to synchronize while we do this
        {
            XMLMutexLock lockConverter(&fMutex);

            targetCap = ucnv_fromUChars
            (
                fConverter
                , 0
                , 0
                , tmpBuf
                , -1
                , &err
            );
        }
    }

    if (err != U_BUFFER_OVERFLOW_ERROR)
        return 0;

    return (XMLSize_t)targetCap;
}